

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O0

void __thiscall
arma::Mat<double>::
Mat<arma::eGlue<arma::Mat<double>,arma::Mat<double>,arma::eglue_minus>,arma::eop_scalar_div_post>
          (Mat<double> *this,
          eOp<arma::eGlue<arma::Mat<double>,_arma::Mat<double>,_arma::eglue_minus>,_arma::eop_scalar_div_post>
          *X)

{
  Mat<double> *this_00;
  eOp<arma::eGlue<arma::Mat<double>,_arma::Mat<double>,_arma::eglue_minus>,_arma::eop_scalar_div_post>
  *in_RSI;
  Mat<double> *in_RDI;
  
  this_00 = (Mat<double> *)(in_RSI->P).Q;
  in_RDI->n_rows = **(uword **)this_00;
  in_RDI->n_cols = ((((in_RSI->P).Q)->P1).Q)->n_cols;
  in_RDI->n_elem = ((((in_RSI->P).Q)->P1).Q)->n_elem;
  in_RDI->n_alloc = 0;
  in_RDI->vec_state = 0;
  in_RDI->mem_state = 0;
  in_RDI->mem = (double *)0x0;
  init_cold(this_00);
  eop_core<arma::eop_scalar_div_post>::
  apply<arma::Mat<double>,arma::eGlue<arma::Mat<double>,arma::Mat<double>,arma::eglue_minus>>
            (in_RDI,in_RSI);
  return;
}

Assistant:

inline
Mat<eT>::Mat(const eOp<T1, eop_type>& X)
  : n_rows(X.get_n_rows())
  , n_cols(X.get_n_cols())
  , n_elem(X.get_n_elem())
  , n_alloc()
  , vec_state(0)
  , mem_state(0)
  , mem()
  {
  arma_debug_sigprint_this(this);
  
  arma_type_check(( is_same_type< eT, typename T1::elem_type >::no ));
  
  init_cold();
  
  eop_type::apply(*this, X);
  }